

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

Type * slang::ast::PackedArrayType::fromDim
                 (Scope *scope,Type *elementType,ConstantRange dim,DeferredSourceRange sourceRange)

{
  Compilation *this;
  long lVar1;
  bitwidth_t bVar2;
  uint uVar3;
  Diagnostic *this_00;
  int iVar4;
  SourceRange sourceRange_00;
  ConstantRange local_38;
  unsigned_long local_30;
  
  local_38 = dim;
  if (elementType->canonical == (Type *)0x0) {
    Type::resolveCanonical(elementType);
  }
  if ((elementType->canonical->super_Symbol).kind != ErrorType) {
    this = scope->compilation;
    bVar2 = Type::getBitWidth(elementType);
    iVar4 = local_38.left - local_38.right;
    if (local_38.left - local_38.right == 0 || local_38.left < local_38.right) {
      iVar4 = -(local_38.left - local_38.right);
    }
    lVar1 = (ulong)bVar2 * (ulong)(iVar4 + 1);
    uVar3 = (uint)lVar1;
    if ((bool)(~((int)((ulong)lVar1 >> 0x20) != 0) & uVar3 < 0x1000000)) {
      local_30 = CONCAT44(local_30._4_4_,uVar3);
      elementType = (Type *)BumpAllocator::
                            emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange&,unsigned_int>
                                      (&this->super_BumpAllocator,elementType,&local_38,
                                       (uint *)&local_30);
      if ((SyntaxNode *)(sourceRange.node.value & 0xfffffffffffffffe) != (SyntaxNode *)0x0) {
        (((PackedArrayType *)elementType)->super_IntegralType).super_Type.super_Symbol.
        originatingSyntax = (SyntaxNode *)(sourceRange.node.value & 0xfffffffffffffffe);
      }
    }
    else {
      bVar2 = Type::getBitWidth(elementType);
      iVar4 = local_38.left - local_38.right;
      if (local_38.left - local_38.right == 0 || local_38.left < local_38.right) {
        iVar4 = -(local_38.left - local_38.right);
      }
      sourceRange_00 = slang::syntax::DeferredSourceRange::get(&sourceRange);
      this_00 = Scope::addDiag(scope,(DiagCode)0x1d0009,sourceRange_00);
      local_30 = (ulong)(iVar4 + 1) * (ulong)bVar2;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&this_00->args,&local_30);
      local_30 = 0xffffff;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&this_00->args,&local_30);
      elementType = this->errorType;
    }
  }
  return (Type *)(PackedArrayType *)elementType;
}

Assistant:

const Type& PackedArrayType::fromDim(const Scope& scope, const Type& elementType, ConstantRange dim,
                                     DeferredSourceRange sourceRange) {
    if (elementType.isError())
        return elementType;

    auto& comp = scope.getCompilation();
    auto width = checkedMulU32(elementType.getBitWidth(), dim.width());
    if (!width || width > (uint32_t)SVInt::MAX_BITS) {
        uint64_t fullWidth = uint64_t(elementType.getBitWidth()) * dim.width();
        scope.addDiag(diag::PackedTypeTooLarge, sourceRange.get())
            << fullWidth << (uint32_t)SVInt::MAX_BITS;
        return comp.getErrorType();
    }

    auto result = comp.emplace<PackedArrayType>(elementType, dim, bitwidth_t(*width));
    if (auto syntax = sourceRange.syntax())
        result->setSyntax(*syntax);

    return *result;
}